

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d * tinyusdz::transpose(matrix4d *_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  matrix4d *in_RDI;
  
  dVar1 = _m->m[0][1];
  dVar2 = _m->m[0][2];
  dVar3 = _m->m[0][3];
  dVar4 = _m->m[1][0];
  dVar5 = _m->m[1][1];
  dVar6 = _m->m[1][2];
  dVar7 = _m->m[1][3];
  dVar8 = _m->m[2][0];
  dVar9 = _m->m[2][1];
  dVar10 = _m->m[2][2];
  dVar11 = _m->m[2][3];
  dVar12 = _m->m[3][0];
  dVar13 = _m->m[3][1];
  dVar14 = _m->m[3][2];
  dVar15 = _m->m[3][3];
  in_RDI->m[0][0] = _m->m[0][0];
  in_RDI->m[0][1] = dVar4;
  in_RDI->m[0][2] = dVar8;
  in_RDI->m[0][3] = dVar12;
  in_RDI->m[1][0] = dVar1;
  in_RDI->m[1][1] = dVar5;
  in_RDI->m[1][2] = dVar9;
  in_RDI->m[1][3] = dVar13;
  in_RDI->m[2][0] = dVar2;
  in_RDI->m[2][1] = dVar6;
  in_RDI->m[2][2] = dVar10;
  in_RDI->m[2][3] = dVar14;
  in_RDI->m[3][0] = dVar3;
  in_RDI->m[3][1] = dVar7;
  in_RDI->m[3][2] = dVar11;
  in_RDI->m[3][3] = dVar15;
  return in_RDI;
}

Assistant:

value::matrix4d transpose(const value::matrix4d &_m) {
  matrix44d m;
  matrix44d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 4 * 4);
  tm = linalg::transpose(m);

  value::matrix4d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 4 * 4);

  return dst;
}